

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.c
# Opt level: O2

uchar * od_ec_enc_done(od_ec_enc *enc,uint32_t *nbytes)

{
  short sVar1;
  od_ec_enc_window oVar2;
  int iVar3;
  uchar *buf;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t uVar9;
  int iVar10;
  
  if (enc->error == 0) {
    sVar1 = enc->cnt;
    iVar10 = (int)sVar1;
    oVar2 = enc->low;
    uVar9 = enc->offs;
    iVar3 = iVar10 + 0x11 >> 3;
    iVar5 = 0;
    if (0 < iVar3) {
      iVar5 = iVar3;
    }
    buf = enc->buf;
    uVar6 = iVar5 + uVar9;
    if (enc->storage < uVar6) {
      buf = (uchar *)realloc(buf,(ulong)uVar6);
      if (buf == (uchar *)0x0) {
        enc->error = -1;
        goto LAB_0023544a;
      }
      enc->buf = buf;
      enc->storage = uVar6;
    }
    if (-10 < sVar1) {
      iVar5 = iVar10 + 0x10;
      uVar8 = oVar2 + 0x3fff & 0xffffffffffff8000 | 0x4000;
      uVar7 = ~(-1L << ((byte)iVar5 & 0x3f));
      iVar10 = iVar10 + 0x12;
      do {
        uVar4 = uVar8 >> ((byte)iVar5 & 0x3f);
        buf[uVar9] = (uchar)uVar4;
        if (((uint)uVar4 >> 8 & 1) != 0) {
          propagate_carry_bwd(buf,uVar9 - 1);
        }
        uVar9 = uVar9 + 1;
        uVar8 = uVar8 & uVar7;
        uVar7 = uVar7 >> 8;
        iVar5 = iVar5 + -8;
        iVar10 = iVar10 + -8;
      } while (8 < iVar10);
    }
    *nbytes = uVar9;
  }
  else {
LAB_0023544a:
    buf = (uchar *)0x0;
  }
  return buf;
}

Assistant:

unsigned char *od_ec_enc_done(od_ec_enc *enc, uint32_t *nbytes) {
  unsigned char *out;
  uint32_t storage;
  uint32_t offs;
  od_ec_enc_window m;
  od_ec_enc_window e;
  od_ec_enc_window l;
  int c;
  int s;
  if (enc->error) return NULL;
#if OD_MEASURE_EC_OVERHEAD
  {
    uint32_t tell;
    /* Don't count the 1 bit we lose to raw bits as overhead. */
    tell = od_ec_enc_tell(enc) - 1;
    fprintf(stderr, "overhead: %f%%\n",
            100 * (tell - enc->entropy) / enc->entropy);
    fprintf(stderr, "efficiency: %f bits/symbol\n",
            (double)tell / enc->nb_symbols);
  }
#endif

  l = enc->low;
  c = enc->cnt;
  s = 10;
  m = 0x3FFF;
  e = ((l + m) & ~m) | (m + 1);
  s += c;
  offs = enc->offs;

  /*Make sure there's enough room for the entropy-coded bits.*/
  out = enc->buf;
  storage = enc->storage;
  const int s_bits = (s + 7) >> 3;
  int b = OD_MAXI(s_bits, 0);
  if (offs + b > storage) {
    storage = offs + b;
    out = (unsigned char *)realloc(out, sizeof(*out) * storage);
    if (out == NULL) {
      enc->error = -1;
      return NULL;
    }
    enc->buf = out;
    enc->storage = storage;
  }

  /*We output the minimum number of bits that ensures that the symbols encoded
     thus far will be decoded correctly regardless of the bits that follow.*/
  if (s > 0) {
    uint64_t n;
    n = ((uint64_t)1 << (c + 16)) - 1;
    do {
      assert(offs < storage);
      uint16_t val = (uint16_t)(e >> (c + 16));
      out[offs] = (unsigned char)(val & 0x00FF);
      if (val & 0x0100) {
        assert(offs > 0);
        propagate_carry_bwd(out, offs - 1);
      }
      offs++;

      e &= n;
      s -= 8;
      c -= 8;
      n >>= 8;
    } while (s > 0);
  }
  *nbytes = offs;

  return out;
}